

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

char * getS(lua_State *L,void *ud,size_t *size)

{
  LoadS *ls;
  size_t *size_local;
  void *ud_local;
  lua_State *L_local;
  
  if (*(long *)((long)ud + 8) == 0) {
    L_local = (lua_State *)0x0;
  }
  else {
    *size = *(size_t *)((long)ud + 8);
    *(undefined8 *)((long)ud + 8) = 0;
    L_local = *ud;
  }
  return (char *)L_local;
}

Assistant:

static const char *getS(lua_State *L, void *ud, size_t *size) {
    LoadS *ls = (LoadS *) ud;
    (void) L;  /* not used */
    if (ls->size == 0) return NULL;
    *size = ls->size;
    ls->size = 0;
    return ls->s;
}